

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManPrintOne(FILE *pFile,If_DsdMan_t *p,int iObjId,uchar *pPermLits,int fNewLine)

{
  If_DsdMan_t *pIVar1;
  If_DsdMan_t *pFile_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  int local_30;
  int local_2c;
  int nSupp;
  int fNewLine_local;
  uchar *pPermLits_local;
  If_DsdMan_t *pIStack_18;
  int iObjId_local;
  If_DsdMan_t *p_local;
  FILE *pFile_local;
  
  local_30 = 0;
  local_2c = fNewLine;
  _nSupp = pPermLits;
  pPermLits_local._4_4_ = iObjId;
  pIStack_18 = p;
  p_local = (If_DsdMan_t *)pFile;
  fprintf((FILE *)pFile,"%6d : ",(ulong)(uint)iObjId);
  pIVar1 = p_local;
  uVar2 = If_DsdVecObjSuppSize(&pIStack_18->vObjs,pPermLits_local._4_4_);
  fprintf((FILE *)pIVar1,"%2d ",(ulong)uVar2);
  pIVar1 = p_local;
  uVar2 = If_DsdVecObjRef(&pIStack_18->vObjs,pPermLits_local._4_4_);
  fprintf((FILE *)pIVar1,"%8d ",(ulong)uVar2);
  pIVar1 = p_local;
  uVar2 = If_DsdVecObjMark(&pIStack_18->vObjs,pPermLits_local._4_4_);
  fprintf((FILE *)pIVar1,"%d  ",(ulong)uVar2);
  pFile_00 = p_local;
  pIVar1 = pIStack_18;
  iVar3 = Abc_Var2Lit(pPermLits_local._4_4_,0);
  If_DsdManPrint_rec((FILE *)pFile_00,pIVar1,iVar3,_nSupp,&local_30);
  if (local_2c != 0) {
    fprintf((FILE *)p_local,"\n");
  }
  iVar3 = local_30;
  iVar4 = If_DsdVecObjSuppSize(&pIStack_18->vObjs,pPermLits_local._4_4_);
  if (iVar3 == iVar4) {
    return;
  }
  __assert_fail("nSupp == If_DsdVecObjSuppSize(&p->vObjs, iObjId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x207,"void If_DsdManPrintOne(FILE *, If_DsdMan_t *, int, unsigned char *, int)");
}

Assistant:

void If_DsdManPrintOne( FILE * pFile, If_DsdMan_t * p, int iObjId, unsigned char * pPermLits, int fNewLine )
{
    int nSupp = 0;
    fprintf( pFile, "%6d : ", iObjId );
    fprintf( pFile, "%2d ",   If_DsdVecObjSuppSize(&p->vObjs, iObjId) );
    fprintf( pFile, "%8d ",   If_DsdVecObjRef(&p->vObjs, iObjId) );
    fprintf( pFile, "%d  ",    If_DsdVecObjMark(&p->vObjs, iObjId) );
    If_DsdManPrint_rec( pFile, p, Abc_Var2Lit(iObjId, 0), pPermLits, &nSupp );
    if ( fNewLine )
        fprintf( pFile, "\n" );
    assert( nSupp == If_DsdVecObjSuppSize(&p->vObjs, iObjId) );
}